

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_getoff_all_pipelines(SessionHandle *data,connectdata *conn)

{
  int iVar1;
  SessionHandle *pSVar2;
  bool bVar3;
  bool bVar4;
  _Bool send_head;
  _Bool recv_head;
  connectdata *conn_local;
  SessionHandle *data_local;
  
  bVar3 = false;
  if ((conn->readchannel_inuse & 1U) != 0) {
    pSVar2 = gethandleathead(conn->recv_pipe);
    bVar3 = pSVar2 == data;
  }
  bVar4 = false;
  if ((conn->writechannel_inuse & 1U) != 0) {
    pSVar2 = gethandleathead(conn->send_pipe);
    bVar4 = pSVar2 == data;
  }
  iVar1 = Curl_removeHandleFromPipeline(data,conn->recv_pipe);
  if ((iVar1 != 0) && (bVar3)) {
    conn->readchannel_inuse = false;
  }
  iVar1 = Curl_removeHandleFromPipeline(data,conn->send_pipe);
  if ((iVar1 != 0) && (bVar4)) {
    conn->writechannel_inuse = false;
  }
  return;
}

Assistant:

void Curl_getoff_all_pipelines(struct SessionHandle *data,
                               struct connectdata *conn)
{
  bool recv_head = (conn->readchannel_inuse &&
    (gethandleathead(conn->recv_pipe) == data)) ? TRUE : FALSE;

  bool send_head = (conn->writechannel_inuse &&
    (gethandleathead(conn->send_pipe) == data)) ? TRUE : FALSE;

  if(Curl_removeHandleFromPipeline(data, conn->recv_pipe) && recv_head)
    conn->readchannel_inuse = FALSE;
  if(Curl_removeHandleFromPipeline(data, conn->send_pipe) && send_head)
    conn->writechannel_inuse = FALSE;
}